

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

bool __thiscall CCoinsViewCache::Sync(CCoinsViewCache *this)

{
  long lVar1;
  CCoinsView *pCVar2;
  int iVar3;
  logic_error *this_00;
  long in_FS_OFFSET;
  CoinsViewCacheCursor cursor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cursor.m_usage = &this->cachedCoinsUsage;
  cursor.m_map = &this->cacheCoins;
  cursor.m_will_erase = false;
  pCVar2 = (this->super_CCoinsViewBacked).base;
  cursor.m_sentinel = &this->m_sentinel;
  iVar3 = (*pCVar2->_vptr_CCoinsView[4])(pCVar2,&cursor,&this->hashBlock);
  if ((SUB41(iVar3,0) == false) || ((this->m_sentinel).second.m_next == &this->m_sentinel)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return SUB41(iVar3,0);
    }
  }
  else {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Not all unspent flagged entries were cleared");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::Sync()
{
    auto cursor{CoinsViewCacheCursor(cachedCoinsUsage, m_sentinel, cacheCoins, /*will_erase=*/false)};
    bool fOk = base->BatchWrite(cursor, hashBlock);
    if (fOk) {
        if (m_sentinel.second.Next() != &m_sentinel) {
            /* BatchWrite must clear flags of all entries */
            throw std::logic_error("Not all unspent flagged entries were cleared");
        }
    }
    return fOk;
}